

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TimingCheckEventConditionSyntax::setChild
          (TimingCheckEventConditionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->tripleAnd).kind = TVar2.kind;
    (this->tripleAnd).field_0x2 = TVar2._2_1_;
    (this->tripleAnd).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->tripleAnd).rawLen = TVar2.rawLen;
    (this->tripleAnd).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar1;
  }
  return;
}

Assistant:

void TimingCheckEventConditionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: tripleAnd = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}